

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm1394.cpp
# Opt level: O0

int GetMenuChoice(AmpIO *Board,string *mcsName)

{
  byte bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  void *pvVar4;
  string local_c0;
  int local_a0;
  byte local_99;
  int c;
  uint32_t uStack_94;
  bool fpgaV3;
  uint32_t hver;
  uint32_t fver;
  termios newTerm;
  termios savedTerm;
  string *mcsName_local;
  AmpIO *Board_local;
  
  tcgetattr(0,(termios *)&newTerm.c_ispeed);
  memcpy(&hver,&newTerm.c_ispeed,0x3c);
  newTerm.c_oflag = newTerm.c_oflag & 0xfffffffd;
  tcsetattr(0,0,(termios *)&hver);
  uStack_94 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
  c = BoardIO::GetHardwareVersion((BoardIO *)Board);
  local_99 = std::__cxx11::string::empty();
  local_99 = local_99 & 1;
  local_a0 = 0;
  while (local_a0 < 0x30 || 0x39 < local_a0) {
    if (local_a0 != 0) {
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"Invalid option -- try again");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Board: ");
    bVar1 = BoardIO::GetBoardId((BoardIO *)Board);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1);
    poVar3 = std::operator<<(poVar3," (");
    BoardIO::GetHardwareVersionString_abi_cxx11_(&local_c0,(BoardIO *)Board);
    poVar3 = std::operator<<(poVar3,(string *)&local_c0);
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_c0);
    if ((local_99 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"MCS file: ");
      poVar3 = std::operator<<(poVar3,(string *)mcsName);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"PROM Id: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
      uVar2 = FpgaIO::PromGetId(&Board->super_FpgaIO);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,uVar2);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"0) Exit programmer");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    if ((local_99 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"1) Program PROM");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"2) Verify PROM");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"3) Read PROM data");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"4) Program FPGA SN");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"5) Program QLA SN");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"6) Read FPGA SN");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"7) Read QLA SN");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      if (uStack_94 < 7) {
        poVar3 = std::operator<<((ostream *)&std::cout,"8) Exit programmer");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"8) Reboot FPGA and exit");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"9) Download PROM to MCS file");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else if (c == 0x44514c41) {
      poVar3 = std::operator<<((ostream *)&std::cout,"4) Program QLA 1 SN");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"5) Program QLA 2 SN");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"6) Read FPGA SN");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"7) Read QLA 1+2 SN");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"5) Program QLA SN");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"6) Read FPGA SN");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"7) Read QLA SN");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"Select option: ");
    local_a0 = getchar();
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  tcsetattr(0,0,(termios *)&newTerm.c_ispeed);
  return local_a0 + -0x30;
}

Assistant:

int GetMenuChoice(AmpIO &Board, const std::string &mcsName)
{
#ifndef _MSC_VER
    struct termios savedTerm, newTerm;
    tcgetattr(STDIN_FILENO, &savedTerm);
    newTerm = savedTerm;
    newTerm.c_lflag &= ~ICANON;  // turn off line buffering
    tcsetattr(STDIN_FILENO, TCSANOW, &newTerm);  // change terminal settings
#endif

    uint32_t fver = Board.GetFirmwareVersion();
    uint32_t hver = Board.GetHardwareVersion();
    bool fpgaV3 = mcsName.empty();
    int c = 0;
    while ((c < '0') || (c > '9')) {
        if (c) {
            std::cout << std::endl << "Invalid option -- try again" << std::endl;
        }
        std::cout << std::endl
                  << "Board: " << (unsigned int)Board.GetBoardId()
                  << " (" << Board.GetHardwareVersionString() << ")" << std::endl;
        if (!fpgaV3) {
            std::cout << "MCS file: " << mcsName << std::endl;
            std::cout << "PROM Id: " << std::hex << Board.PromGetId() << std::dec
                      << std::endl << std::endl;
        }

        std::cout << "0) Exit programmer" << std::endl;
        if (!fpgaV3) {
            std::cout << "1) Program PROM" << std::endl
                      << "2) Verify PROM" << std::endl
                      << "3) Read PROM data" << std::endl
                      << "4) Program FPGA SN" << std::endl
                      << "5) Program QLA SN" << std::endl
                      << "6) Read FPGA SN" << std::endl
                      << "7) Read QLA SN" << std::endl;
            if (fver >= 7)
                std::cout << "8) Reboot FPGA and exit" << std::endl;
            else
                std::cout << "8) Exit programmer" << std::endl;
            std::cout << "9) Download PROM to MCS file" << std::endl;
        }
        else {
            // With FPGA V3, we can only program or read the QLA PROM,
            // or read the FPGA S/N
            if (hver == DQLA_String) {
                std::cout << "4) Program QLA 1 SN" << std::endl
                          << "5) Program QLA 2 SN" << std::endl
                          << "6) Read FPGA SN" << std::endl
                          << "7) Read QLA 1+2 SN" << std::endl;
            }
            else {
                std::cout << "5) Program QLA SN" << std::endl
                          << "6) Read FPGA SN" << std::endl
                          << "7) Read QLA SN" << std::endl;
            }
        }
        std::cout << std::endl;

        std::cout << "Select option: ";
#ifdef _MSC_VER
        c = _getche();
#else
        c = getchar();
#endif
        std::cout << std::endl;
    }

#ifndef _MSC_VER
    tcsetattr(STDIN_FILENO, TCSANOW, &savedTerm);  // restore terminal settings
#endif
    return (c-'0');
}